

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O3

void aom_highbd_lpf_horizontal_6_sse2
               (uint16_t *s,int p,uint8_t *_blimit,uint8_t *_limit,uint8_t *_thresh,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  long lVar37;
  long lVar38;
  undefined1 auVar39 [16];
  short sVar41;
  undefined1 auVar40 [16];
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  undefined1 auVar46 [16];
  ushort uVar47;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  undefined1 auVar49 [16];
  ushort uVar56;
  short sVar57;
  undefined4 uVar58;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  short sVar65;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  undefined1 auVar66 [16];
  short sVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  short sVar78;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  undefined1 auVar79 [16];
  short sVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  ushort uVar87;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  ushort uVar100;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined4 uVar106;
  short sVar112;
  short sVar113;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  short sVar48;
  
  lVar38 = (long)(p * 2);
  lVar37 = (long)p;
  uVar1 = *(undefined8 *)(s + -lVar37);
  uVar6 = *(undefined8 *)s;
  auVar46._8_8_ = uVar6;
  auVar46._0_8_ = uVar1;
  uVar2 = *(undefined8 *)(s + lVar37);
  uVar3 = *(undefined8 *)(s + -lVar38);
  auVar73._8_8_ = uVar3;
  auVar73._0_8_ = uVar1;
  auVar79._8_8_ = uVar2;
  auVar79._0_8_ = uVar3;
  uVar4 = *(undefined8 *)(s + -(long)(p * 3));
  uVar5 = *(undefined8 *)(s + lVar38);
  auVar66._8_8_ = uVar5;
  auVar66._0_8_ = uVar4;
  auVar39 = *(undefined1 (*) [16])_blimit;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar39._0_13_;
  auVar7[0xe] = auVar39[7];
  auVar10[0xc] = auVar39[6];
  auVar10._0_12_ = auVar39._0_12_;
  auVar10._13_2_ = auVar7._13_2_;
  auVar13[0xb] = 0;
  auVar13._0_11_ = auVar39._0_11_;
  auVar13._12_3_ = auVar10._12_3_;
  auVar16[10] = auVar39[5];
  auVar16._0_10_ = auVar39._0_10_;
  auVar16._11_4_ = auVar13._11_4_;
  auVar19[9] = 0;
  auVar19._0_9_ = auVar39._0_9_;
  auVar19._10_5_ = auVar16._10_5_;
  auVar22[8] = auVar39[4];
  auVar22._0_8_ = auVar39._0_8_;
  auVar22._9_6_ = auVar19._9_6_;
  auVar28._7_8_ = 0;
  auVar28._0_7_ = auVar22._8_7_;
  auVar31._1_8_ = SUB158(auVar28 << 0x40,7);
  auVar31[0] = auVar39[3];
  auVar31._9_6_ = 0;
  auVar32._1_10_ = SUB1510(auVar31 << 0x30,5);
  auVar32[0] = auVar39[2];
  auVar32._11_4_ = 0;
  auVar25[2] = auVar39[1];
  auVar25._0_2_ = auVar39._0_2_;
  auVar25._3_12_ = SUB1512(auVar32 << 0x20,3);
  auVar85._0_2_ = auVar39._0_2_ & 0xff;
  auVar85._2_13_ = auVar25._2_13_;
  auVar85[0xf] = 0;
  auVar49 = ZEXT416(bd - 8);
  auVar86 = psllw(auVar85,auVar49);
  auVar39 = *(undefined1 (*) [16])_limit;
  auVar8[0xd] = 0;
  auVar8._0_13_ = auVar39._0_13_;
  auVar8[0xe] = auVar39[7];
  auVar11[0xc] = auVar39[6];
  auVar11._0_12_ = auVar39._0_12_;
  auVar11._13_2_ = auVar8._13_2_;
  auVar14[0xb] = 0;
  auVar14._0_11_ = auVar39._0_11_;
  auVar14._12_3_ = auVar11._12_3_;
  auVar17[10] = auVar39[5];
  auVar17._0_10_ = auVar39._0_10_;
  auVar17._11_4_ = auVar14._11_4_;
  auVar20[9] = 0;
  auVar20._0_9_ = auVar39._0_9_;
  auVar20._10_5_ = auVar17._10_5_;
  auVar23[8] = auVar39[4];
  auVar23._0_8_ = auVar39._0_8_;
  auVar23._9_6_ = auVar20._9_6_;
  auVar29._7_8_ = 0;
  auVar29._0_7_ = auVar23._8_7_;
  auVar33._1_8_ = SUB158(auVar29 << 0x40,7);
  auVar33[0] = auVar39[3];
  auVar33._9_6_ = 0;
  auVar34._1_10_ = SUB1510(auVar33 << 0x30,5);
  auVar34[0] = auVar39[2];
  auVar34._11_4_ = 0;
  auVar26[2] = auVar39[1];
  auVar26._0_2_ = auVar39._0_2_;
  auVar26._3_12_ = SUB1512(auVar34 << 0x20,3);
  auVar88._0_2_ = auVar39._0_2_ & 0xff;
  auVar88._2_13_ = auVar26._2_13_;
  auVar88[0xf] = 0;
  auVar89 = psllw(auVar88,auVar49);
  auVar39 = *(undefined1 (*) [16])_thresh;
  auVar9[0xd] = 0;
  auVar9._0_13_ = auVar39._0_13_;
  auVar9[0xe] = auVar39[7];
  auVar12[0xc] = auVar39[6];
  auVar12._0_12_ = auVar39._0_12_;
  auVar12._13_2_ = auVar9._13_2_;
  auVar15[0xb] = 0;
  auVar15._0_11_ = auVar39._0_11_;
  auVar15._12_3_ = auVar12._12_3_;
  auVar18[10] = auVar39[5];
  auVar18._0_10_ = auVar39._0_10_;
  auVar18._11_4_ = auVar15._11_4_;
  auVar21[9] = 0;
  auVar21._0_9_ = auVar39._0_9_;
  auVar21._10_5_ = auVar18._10_5_;
  auVar24[8] = auVar39[4];
  auVar24._0_8_ = auVar39._0_8_;
  auVar24._9_6_ = auVar21._9_6_;
  auVar30._7_8_ = 0;
  auVar30._0_7_ = auVar24._8_7_;
  auVar35._1_8_ = SUB158(auVar30 << 0x40,7);
  auVar35[0] = auVar39[3];
  auVar35._9_6_ = 0;
  auVar36._1_10_ = SUB1510(auVar35 << 0x30,5);
  auVar36[0] = auVar39[2];
  auVar36._11_4_ = 0;
  auVar27[2] = auVar39[1];
  auVar27._0_2_ = auVar39._0_2_;
  auVar27._3_12_ = SUB1512(auVar36 << 0x20,3);
  auVar101._0_2_ = auVar39._0_2_ & 0xff;
  auVar101._2_13_ = auVar27._2_13_;
  auVar101[0xf] = 0;
  auVar102 = psllw(auVar101,auVar49);
  auVar39._8_4_ = (int)uVar2;
  auVar39._0_8_ = uVar6;
  auVar39._12_4_ = (int)((ulong)uVar2 >> 0x20);
  auVar59 = psubusw(auVar73,auVar39);
  auVar107 = psubusw(auVar39,auVar73);
  auVar107 = auVar107 | auVar59;
  auVar59 = paddusw(auVar107,auVar107);
  auVar60._0_8_ = auVar59._0_8_;
  auVar60._8_8_ = 0;
  auVar108._0_2_ = auVar107._8_2_ >> 1;
  auVar108._2_2_ = auVar107._10_2_ >> 1;
  auVar108._4_2_ = auVar107._12_2_ >> 1;
  auVar108._6_2_ = auVar107._14_2_ >> 1;
  auVar108._8_8_ = 0;
  auVar59 = paddusw(auVar108,auVar60);
  auVar59 = auVar59 ^ _DAT_00beb230;
  auVar86 = auVar86 ^ _DAT_00beb230;
  auVar109._0_2_ = -(ushort)(auVar86._0_2_ < auVar59._0_2_);
  auVar109._2_2_ = -(ushort)(auVar86._2_2_ < auVar59._2_2_);
  auVar109._4_2_ = -(ushort)(auVar86._4_2_ < auVar59._4_2_);
  auVar109._6_2_ = -(ushort)(auVar86._6_2_ < auVar59._6_2_);
  auVar109._8_2_ = -(ushort)(auVar86._8_2_ < auVar59._8_2_);
  auVar109._10_2_ = -(ushort)(auVar86._10_2_ < auVar59._10_2_);
  auVar109._12_2_ = -(ushort)(auVar86._12_2_ < auVar59._12_2_);
  auVar109._14_2_ = -(ushort)(auVar86._14_2_ < auVar59._14_2_);
  auVar107 = paddusw(auVar89,_DAT_00beb0f0);
  auVar107 = auVar107 & auVar109;
  auVar59 = psubusw(auVar46,auVar79);
  auVar86 = psubusw(auVar79,auVar46);
  auVar86 = auVar86 | auVar59;
  auVar110 = psubusw(auVar66,auVar79);
  auVar59 = psubusw(auVar79,auVar66);
  auVar59 = auVar59 | auVar110;
  sVar57 = auVar86._0_2_;
  sVar83 = auVar86._8_2_;
  auVar111._0_2_ = (ushort)(sVar83 < sVar57) * sVar57 | (ushort)(sVar83 >= sVar57) * sVar83;
  sVar61 = auVar86._2_2_;
  sVar84 = auVar86._10_2_;
  auVar111._2_2_ = (ushort)(sVar84 < sVar61) * sVar61 | (ushort)(sVar84 >= sVar61) * sVar84;
  sVar62 = auVar86._4_2_;
  sVar112 = auVar86._12_2_;
  auVar111._4_2_ = (ushort)(sVar112 < sVar62) * sVar62 | (ushort)(sVar112 >= sVar62) * sVar112;
  sVar63 = auVar86._6_2_;
  sVar113 = auVar86._14_2_;
  auVar111._6_2_ = (ushort)(sVar113 < sVar63) * sVar63 | (ushort)(sVar113 >= sVar63) * sVar113;
  sVar43 = (ushort)(0 < sVar83) * sVar83;
  auVar111._8_2_ = sVar43;
  sVar42 = (ushort)(0 < sVar84) * sVar84;
  auVar111._10_2_ = sVar42;
  sVar45 = (ushort)(0 < sVar112) * sVar112;
  auVar111._12_2_ = sVar45;
  sVar44 = (ushort)(0 < sVar113) * sVar113;
  auVar111._14_2_ = sVar44;
  sVar48 = auVar59._0_2_;
  uVar47 = (sVar48 < (short)auVar111._0_2_) * auVar111._0_2_ |
           (ushort)(sVar48 >= (short)auVar111._0_2_) * sVar48;
  sVar48 = auVar59._2_2_;
  uVar50 = (sVar48 < (short)auVar111._2_2_) * auVar111._2_2_ |
           (ushort)(sVar48 >= (short)auVar111._2_2_) * sVar48;
  sVar48 = auVar59._4_2_;
  uVar51 = (sVar48 < (short)auVar111._4_2_) * auVar111._4_2_ |
           (ushort)(sVar48 >= (short)auVar111._4_2_) * sVar48;
  sVar48 = auVar59._6_2_;
  uVar52 = (sVar48 < (short)auVar111._6_2_) * auVar111._6_2_ |
           (ushort)(sVar48 >= (short)auVar111._6_2_) * sVar48;
  sVar48 = auVar59._8_2_;
  uVar53 = (ushort)(sVar48 < sVar43) * sVar43 | (ushort)(sVar48 >= sVar43) * sVar48;
  sVar43 = auVar59._10_2_;
  uVar54 = (ushort)(sVar43 < sVar42) * sVar42 | (ushort)(sVar43 >= sVar42) * sVar43;
  sVar42 = auVar59._12_2_;
  sVar43 = auVar59._14_2_;
  uVar55 = (ushort)(sVar42 < sVar45) * sVar45 | (ushort)(sVar42 >= sVar45) * sVar42;
  uVar56 = (ushort)(sVar43 < sVar44) * sVar44 | (ushort)(sVar43 >= sVar44) * sVar43;
  auVar111 = auVar111 ^ _DAT_00beb230;
  auVar102 = auVar102 ^ _DAT_00beb230;
  uVar106 = CONCAT22(-(ushort)(auVar102._2_2_ < auVar111._2_2_),
                     -(ushort)(auVar102._0_2_ < auVar111._0_2_));
  sVar42 = auVar107._0_2_;
  uVar47 = (ushort)((short)uVar47 < sVar42) * sVar42 | ((short)uVar47 >= sVar42) * uVar47;
  sVar42 = auVar107._2_2_;
  uVar50 = (ushort)((short)uVar50 < sVar42) * sVar42 | ((short)uVar50 >= sVar42) * uVar50;
  sVar42 = auVar107._4_2_;
  uVar51 = (ushort)((short)uVar51 < sVar42) * sVar42 | ((short)uVar51 >= sVar42) * uVar51;
  sVar42 = auVar107._6_2_;
  uVar52 = (ushort)((short)uVar52 < sVar42) * sVar42 | ((short)uVar52 >= sVar42) * uVar52;
  sVar42 = auVar107._8_2_;
  uVar53 = (ushort)((short)uVar53 < sVar42) * sVar42 | ((short)uVar53 >= sVar42) * uVar53;
  sVar42 = auVar107._10_2_;
  uVar54 = (ushort)((short)uVar54 < sVar42) * sVar42 | ((short)uVar54 >= sVar42) * uVar54;
  sVar42 = auVar107._12_2_;
  uVar55 = (ushort)((short)uVar55 < sVar42) * sVar42 | ((short)uVar55 >= sVar42) * uVar55;
  sVar42 = auVar107._14_2_;
  uVar56 = (ushort)((short)uVar56 < sVar42) * sVar42 | ((short)uVar56 >= sVar42) * uVar56;
  auVar59 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar59 = pshuflw(auVar59,auVar59,0);
  uVar58 = auVar59._0_4_;
  auVar105._4_4_ = uVar58;
  auVar105._0_4_ = uVar58;
  auVar105._8_4_ = uVar58;
  auVar105._12_4_ = uVar58;
  uVar58 = (undefined4)
           (CONCAT26(-(ushort)(auVar102._6_2_ < auVar111._6_2_),
                     CONCAT24(-(ushort)(auVar102._4_2_ < auVar111._4_2_),uVar106)) >> 0x20);
  auVar114._4_4_ = uVar58;
  auVar114._0_4_ = uVar106;
  auVar114._8_4_ = uVar106;
  auVar114._12_4_ = uVar58;
  auVar103._0_2_ =
       ((short)uVar53 < (short)uVar47) * uVar47 | ((short)uVar53 >= (short)uVar47) * uVar53;
  auVar103._2_2_ =
       ((short)uVar54 < (short)uVar50) * uVar50 | ((short)uVar54 >= (short)uVar50) * uVar54;
  auVar103._4_2_ =
       ((short)uVar55 < (short)uVar51) * uVar51 | ((short)uVar55 >= (short)uVar51) * uVar55;
  auVar103._6_2_ =
       ((short)uVar56 < (short)uVar52) * uVar52 | ((short)uVar56 >= (short)uVar52) * uVar56;
  auVar103._8_2_ = (0 < (short)uVar53) * uVar53;
  auVar103._10_2_ = (0 < (short)uVar54) * uVar54;
  auVar103._12_2_ = (0 < (short)uVar55) * uVar55;
  auVar103._14_2_ = (0 < (short)uVar56) * uVar56;
  auVar89 = psubusw(auVar103,auVar89);
  auVar59 = psllw(_DAT_00beb0f0,ZEXT416((uint)bd));
  auVar90._8_4_ = 0xffffffff;
  auVar90._0_8_ = 0xffffffffffffffff;
  auVar90._12_4_ = 0xffffffff;
  auVar59 = paddsw(auVar59,auVar90);
  auVar102 = psubsw(auVar59,auVar105);
  auVar86 = psubsw((undefined1  [16])0x0,auVar105);
  auVar59 = psubsw(auVar73,auVar105);
  auVar39 = psubsw(auVar39,auVar105);
  auVar73 = psubsw(auVar59,auVar39);
  sVar68 = auVar102._0_2_;
  sVar42 = auVar73._0_2_;
  uVar47 = (ushort)(sVar68 < sVar42) * sVar68 | (ushort)(sVar68 >= sVar42) * sVar42;
  sVar69 = auVar102._2_2_;
  sVar42 = auVar73._2_2_;
  uVar50 = (ushort)(sVar69 < sVar42) * sVar69 | (ushort)(sVar69 >= sVar42) * sVar42;
  sVar70 = auVar102._4_2_;
  sVar42 = auVar73._4_2_;
  uVar51 = (ushort)(sVar70 < sVar42) * sVar70 | (ushort)(sVar70 >= sVar42) * sVar42;
  sVar71 = auVar102._6_2_;
  sVar42 = auVar73._6_2_;
  uVar52 = (ushort)(sVar71 < sVar42) * sVar71 | (ushort)(sVar71 >= sVar42) * sVar42;
  sVar72 = auVar102._8_2_;
  sVar42 = auVar73._8_2_;
  uVar53 = (ushort)(sVar72 < sVar42) * sVar72 | (ushort)(sVar72 >= sVar42) * sVar42;
  sVar78 = auVar102._10_2_;
  sVar42 = auVar73._10_2_;
  uVar54 = (ushort)(sVar78 < sVar42) * sVar78 | (ushort)(sVar78 >= sVar42) * sVar42;
  sVar80 = auVar102._12_2_;
  sVar42 = auVar73._12_2_;
  sVar43 = auVar73._14_2_;
  uVar55 = (ushort)(sVar80 < sVar42) * sVar80 | (ushort)(sVar80 >= sVar42) * sVar42;
  sVar81 = auVar102._14_2_;
  uVar56 = (ushort)(sVar81 < sVar43) * sVar81 | (ushort)(sVar81 >= sVar43) * sVar43;
  sVar42 = auVar86._0_2_;
  auVar74._0_2_ = (ushort)((short)uVar47 < sVar42) * sVar42 | ((short)uVar47 >= sVar42) * uVar47;
  sVar43 = auVar86._2_2_;
  auVar74._2_2_ = (ushort)((short)uVar50 < sVar43) * sVar43 | ((short)uVar50 >= sVar43) * uVar50;
  sVar44 = auVar86._4_2_;
  auVar74._4_2_ = (ushort)((short)uVar51 < sVar44) * sVar44 | ((short)uVar51 >= sVar44) * uVar51;
  sVar45 = auVar86._6_2_;
  auVar74._6_2_ = (ushort)((short)uVar52 < sVar45) * sVar45 | ((short)uVar52 >= sVar45) * uVar52;
  sVar48 = auVar86._8_2_;
  auVar74._8_2_ = (ushort)((short)uVar53 < sVar48) * sVar48 | ((short)uVar53 >= sVar48) * uVar53;
  sVar64 = auVar86._10_2_;
  auVar74._10_2_ = (ushort)((short)uVar54 < sVar64) * sVar64 | ((short)uVar54 >= sVar64) * uVar54;
  sVar65 = auVar86._12_2_;
  auVar74._12_2_ = (ushort)((short)uVar55 < sVar65) * sVar65 | ((short)uVar55 >= sVar65) * uVar55;
  sVar67 = auVar86._14_2_;
  auVar74._14_2_ = (ushort)((short)uVar56 < sVar67) * sVar67 | ((short)uVar56 >= sVar67) * uVar56;
  auVar73 = psubsw(auVar74 >> 0x40 & auVar114,auVar74);
  auVar73 = psubsw(auVar73,auVar74);
  auVar73 = psubsw(auVar73,auVar74);
  auVar104._0_2_ = -(ushort)(auVar89._0_2_ == 0);
  auVar104._2_2_ = -(ushort)(auVar89._2_2_ == 0);
  auVar104._4_2_ = -(ushort)(auVar89._4_2_ == 0);
  auVar104._6_2_ = -(ushort)(auVar89._6_2_ == 0);
  auVar104._8_2_ = -(ushort)(auVar89._8_2_ == 0);
  auVar104._10_2_ = -(ushort)(auVar89._10_2_ == 0);
  auVar104._12_2_ = -(ushort)(auVar89._12_2_ == 0);
  auVar104._14_2_ = -(ushort)(auVar89._14_2_ == 0);
  sVar82 = auVar73._0_2_;
  uVar47 = (ushort)(sVar68 < sVar82) * sVar68 | (ushort)(sVar68 >= sVar82) * sVar82;
  sVar82 = auVar73._2_2_;
  uVar50 = (ushort)(sVar69 < sVar82) * sVar69 | (ushort)(sVar69 >= sVar82) * sVar82;
  sVar82 = auVar73._4_2_;
  uVar51 = (ushort)(sVar70 < sVar82) * sVar70 | (ushort)(sVar70 >= sVar82) * sVar82;
  sVar82 = auVar73._6_2_;
  uVar52 = (ushort)(sVar71 < sVar82) * sVar71 | (ushort)(sVar71 >= sVar82) * sVar82;
  sVar82 = auVar73._8_2_;
  uVar53 = (ushort)(sVar72 < sVar82) * sVar72 | (ushort)(sVar72 >= sVar82) * sVar82;
  sVar82 = auVar73._10_2_;
  uVar54 = (ushort)(sVar78 < sVar82) * sVar78 | (ushort)(sVar78 >= sVar82) * sVar82;
  sVar82 = auVar73._12_2_;
  sVar41 = auVar73._14_2_;
  uVar55 = (ushort)(sVar80 < sVar82) * sVar80 | (ushort)(sVar80 >= sVar82) * sVar82;
  uVar56 = (ushort)(sVar81 < sVar41) * sVar81 | (ushort)(sVar81 >= sVar41) * sVar41;
  auVar89._0_2_ = (ushort)((short)uVar47 < sVar42) * sVar42 | ((short)uVar47 >= sVar42) * uVar47;
  auVar89._2_2_ = (ushort)((short)uVar50 < sVar43) * sVar43 | ((short)uVar50 >= sVar43) * uVar50;
  auVar89._4_2_ = (ushort)((short)uVar51 < sVar44) * sVar44 | ((short)uVar51 >= sVar44) * uVar51;
  auVar89._6_2_ = (ushort)((short)uVar52 < sVar45) * sVar45 | ((short)uVar52 >= sVar45) * uVar52;
  auVar89._8_2_ = (ushort)((short)uVar53 < sVar48) * sVar48 | ((short)uVar53 >= sVar48) * uVar53;
  auVar89._10_2_ = (ushort)((short)uVar54 < sVar64) * sVar64 | ((short)uVar54 >= sVar64) * uVar54;
  auVar89._12_2_ = (ushort)((short)uVar55 < sVar65) * sVar65 | ((short)uVar55 >= sVar65) * uVar55;
  auVar89._14_2_ = (ushort)((short)uVar56 < sVar67) * sVar67 | ((short)uVar56 >= sVar67) * uVar56;
  auVar89 = auVar89 & auVar104;
  auVar102._0_8_ = auVar89._0_8_;
  auVar102._8_4_ = auVar89._0_4_;
  auVar102._12_4_ = auVar89._4_4_;
  auVar73 = paddsw(auVar102,_DAT_00d129c0);
  sVar82 = auVar73._0_2_;
  uVar47 = (ushort)(sVar68 < sVar82) * sVar68 | (ushort)(sVar68 >= sVar82) * sVar82;
  sVar82 = auVar73._2_2_;
  uVar50 = (ushort)(sVar69 < sVar82) * sVar69 | (ushort)(sVar69 >= sVar82) * sVar82;
  sVar82 = auVar73._4_2_;
  uVar51 = (ushort)(sVar70 < sVar82) * sVar70 | (ushort)(sVar70 >= sVar82) * sVar82;
  sVar82 = auVar73._6_2_;
  uVar52 = (ushort)(sVar71 < sVar82) * sVar71 | (ushort)(sVar71 >= sVar82) * sVar82;
  sVar82 = auVar73._8_2_;
  uVar53 = (ushort)(sVar72 < sVar82) * sVar72 | (ushort)(sVar72 >= sVar82) * sVar82;
  sVar82 = auVar73._10_2_;
  uVar54 = (ushort)(sVar78 < sVar82) * sVar78 | (ushort)(sVar78 >= sVar82) * sVar82;
  sVar82 = auVar73._12_2_;
  sVar41 = auVar73._14_2_;
  uVar55 = (ushort)(sVar80 < sVar82) * sVar80 | (ushort)(sVar80 >= sVar82) * sVar82;
  uVar56 = (ushort)(sVar81 < sVar41) * sVar81 | (ushort)(sVar81 >= sVar41) * sVar41;
  auVar107._0_2_ = (ushort)((short)uVar47 < sVar42) * sVar42 | ((short)uVar47 >= sVar42) * uVar47;
  auVar107._2_2_ = (ushort)((short)uVar50 < sVar43) * sVar43 | ((short)uVar50 >= sVar43) * uVar50;
  auVar107._4_2_ = (ushort)((short)uVar51 < sVar44) * sVar44 | ((short)uVar51 >= sVar44) * uVar51;
  auVar107._6_2_ = (ushort)((short)uVar52 < sVar45) * sVar45 | ((short)uVar52 >= sVar45) * uVar52;
  auVar107._8_2_ = (ushort)((short)uVar53 < sVar48) * sVar48 | ((short)uVar53 >= sVar48) * uVar53;
  auVar107._10_2_ = (ushort)((short)uVar54 < sVar64) * sVar64 | ((short)uVar54 >= sVar64) * uVar54;
  auVar107._12_2_ = (ushort)((short)uVar55 < sVar65) * sVar65 | ((short)uVar55 >= sVar65) * uVar55;
  auVar107._14_2_ = (ushort)((short)uVar56 < sVar67) * sVar67 | ((short)uVar56 >= sVar67) * uVar56;
  auVar73 = psraw(auVar107,3);
  auVar75._0_2_ = auVar73._0_2_ + 1;
  auVar75._2_2_ = auVar73._2_2_ + 1;
  auVar75._4_2_ = auVar73._4_2_ + 1;
  auVar75._6_2_ = auVar73._6_2_ + 1;
  auVar75._8_2_ = auVar73._0_2_ + 1;
  auVar75._10_2_ = auVar73._2_2_ + 1;
  auVar75._12_2_ = auVar73._4_2_ + 1;
  auVar75._14_2_ = auVar73._6_2_ + 1;
  auVar86 = psraw(auVar75,1);
  auVar91._8_8_ = SUB168(~auVar114 & auVar86,8);
  auVar91._0_8_ = auVar73._8_8_;
  auVar110._8_8_ = SUB168(~auVar114 & auVar86,0);
  auVar110._0_8_ = auVar73._0_8_;
  auVar39 = psubsw(auVar39,auVar110);
  auVar59 = paddsw(auVar91,auVar59);
  sVar82 = auVar39._0_2_;
  uVar47 = (ushort)(sVar68 < sVar82) * sVar68 | (ushort)(sVar68 >= sVar82) * sVar82;
  sVar82 = auVar39._2_2_;
  uVar50 = (ushort)(sVar69 < sVar82) * sVar69 | (ushort)(sVar69 >= sVar82) * sVar82;
  sVar82 = auVar39._4_2_;
  uVar51 = (ushort)(sVar70 < sVar82) * sVar70 | (ushort)(sVar70 >= sVar82) * sVar82;
  sVar82 = auVar39._6_2_;
  uVar52 = (ushort)(sVar71 < sVar82) * sVar71 | (ushort)(sVar71 >= sVar82) * sVar82;
  sVar82 = auVar39._8_2_;
  uVar53 = (ushort)(sVar72 < sVar82) * sVar72 | (ushort)(sVar72 >= sVar82) * sVar82;
  sVar82 = auVar39._10_2_;
  uVar54 = (ushort)(sVar78 < sVar82) * sVar78 | (ushort)(sVar78 >= sVar82) * sVar82;
  sVar82 = auVar39._12_2_;
  sVar41 = auVar39._14_2_;
  uVar55 = (ushort)(sVar80 < sVar82) * sVar80 | (ushort)(sVar80 >= sVar82) * sVar82;
  uVar56 = (ushort)(sVar81 < sVar41) * sVar81 | (ushort)(sVar81 >= sVar41) * sVar41;
  sVar82 = auVar59._0_2_;
  uVar87 = (ushort)(sVar68 < sVar82) * sVar68 | (ushort)(sVar68 >= sVar82) * sVar82;
  sVar68 = auVar59._2_2_;
  uVar94 = (ushort)(sVar69 < sVar68) * sVar69 | (ushort)(sVar69 >= sVar68) * sVar68;
  sVar68 = auVar59._4_2_;
  uVar95 = (ushort)(sVar70 < sVar68) * sVar70 | (ushort)(sVar70 >= sVar68) * sVar68;
  sVar68 = auVar59._6_2_;
  uVar96 = (ushort)(sVar71 < sVar68) * sVar71 | (ushort)(sVar71 >= sVar68) * sVar68;
  sVar68 = auVar59._8_2_;
  uVar97 = (ushort)(sVar72 < sVar68) * sVar72 | (ushort)(sVar72 >= sVar68) * sVar68;
  sVar68 = auVar59._10_2_;
  uVar98 = (ushort)(sVar78 < sVar68) * sVar78 | (ushort)(sVar78 >= sVar68) * sVar68;
  sVar68 = auVar59._12_2_;
  sVar69 = auVar59._14_2_;
  uVar99 = (ushort)(sVar80 < sVar68) * sVar80 | (ushort)(sVar80 >= sVar68) * sVar68;
  uVar100 = (ushort)(sVar81 < sVar69) * sVar81 | (ushort)(sVar81 >= sVar69) * sVar69;
  auVar59._0_2_ = (ushort)((short)uVar47 < sVar42) * sVar42 | ((short)uVar47 >= sVar42) * uVar47;
  auVar59._2_2_ = (ushort)((short)uVar50 < sVar43) * sVar43 | ((short)uVar50 >= sVar43) * uVar50;
  auVar59._4_2_ = (ushort)((short)uVar51 < sVar44) * sVar44 | ((short)uVar51 >= sVar44) * uVar51;
  auVar59._6_2_ = (ushort)((short)uVar52 < sVar45) * sVar45 | ((short)uVar52 >= sVar45) * uVar52;
  auVar59._8_2_ = (ushort)((short)uVar53 < sVar48) * sVar48 | ((short)uVar53 >= sVar48) * uVar53;
  auVar59._10_2_ = (ushort)((short)uVar54 < sVar64) * sVar64 | ((short)uVar54 >= sVar64) * uVar54;
  auVar59._12_2_ = (ushort)((short)uVar55 < sVar65) * sVar65 | ((short)uVar55 >= sVar65) * uVar55;
  auVar59._14_2_ = (ushort)((short)uVar56 < sVar67) * sVar67 | ((short)uVar56 >= sVar67) * uVar56;
  auVar92._0_2_ = (ushort)((short)uVar87 < sVar42) * sVar42 | ((short)uVar87 >= sVar42) * uVar87;
  auVar92._2_2_ = (ushort)((short)uVar94 < sVar43) * sVar43 | ((short)uVar94 >= sVar43) * uVar94;
  auVar92._4_2_ = (ushort)((short)uVar95 < sVar44) * sVar44 | ((short)uVar95 >= sVar44) * uVar95;
  auVar92._6_2_ = (ushort)((short)uVar96 < sVar45) * sVar45 | ((short)uVar96 >= sVar45) * uVar96;
  auVar92._8_2_ = (ushort)((short)uVar97 < sVar48) * sVar48 | ((short)uVar97 >= sVar48) * uVar97;
  auVar92._10_2_ = (ushort)((short)uVar98 < sVar64) * sVar64 | ((short)uVar98 >= sVar64) * uVar98;
  auVar92._12_2_ = (ushort)((short)uVar99 < sVar65) * sVar65 | ((short)uVar99 >= sVar65) * uVar99;
  auVar92._14_2_ = (ushort)((short)uVar100 < sVar67) * sVar67 | ((short)uVar100 >= sVar67) * uVar100
  ;
  auVar39 = paddsw(auVar59,auVar105);
  auVar89 = paddsw(auVar92,auVar105);
  auVar59 = psubusw(auVar66,auVar46);
  auVar73 = psubusw(auVar46,auVar66);
  auVar73 = auVar73 | auVar59;
  sVar42 = auVar73._0_2_;
  uVar47 = (ushort)(sVar42 < sVar57) * sVar57 | (ushort)(sVar42 >= sVar57) * sVar42;
  sVar42 = auVar73._2_2_;
  uVar50 = (ushort)(sVar42 < sVar61) * sVar61 | (ushort)(sVar42 >= sVar61) * sVar42;
  sVar42 = auVar73._4_2_;
  uVar51 = (ushort)(sVar42 < sVar62) * sVar62 | (ushort)(sVar42 >= sVar62) * sVar42;
  sVar42 = auVar73._6_2_;
  uVar52 = (ushort)(sVar42 < sVar63) * sVar63 | (ushort)(sVar42 >= sVar63) * sVar42;
  sVar42 = auVar73._8_2_;
  uVar53 = (ushort)(sVar42 < sVar83) * sVar83 | (ushort)(sVar42 >= sVar83) * sVar42;
  sVar42 = auVar73._10_2_;
  uVar54 = (ushort)(sVar42 < sVar84) * sVar84 | (ushort)(sVar42 >= sVar84) * sVar42;
  sVar42 = auVar73._12_2_;
  sVar43 = auVar73._14_2_;
  uVar55 = (ushort)(sVar42 < sVar112) * sVar112 | (ushort)(sVar42 >= sVar112) * sVar42;
  uVar56 = (ushort)(sVar43 < sVar113) * sVar113 | (ushort)(sVar43 >= sVar113) * sVar43;
  auVar59 = psllw(_DAT_00beb0f0,auVar49);
  auVar49._0_2_ =
       ((short)uVar53 < (short)uVar47) * uVar47 | ((short)uVar53 >= (short)uVar47) * uVar53;
  auVar49._2_2_ =
       ((short)uVar54 < (short)uVar50) * uVar50 | ((short)uVar54 >= (short)uVar50) * uVar54;
  auVar49._4_2_ =
       ((short)uVar55 < (short)uVar51) * uVar51 | ((short)uVar55 >= (short)uVar51) * uVar55;
  auVar49._6_2_ =
       ((short)uVar56 < (short)uVar52) * uVar52 | ((short)uVar56 >= (short)uVar52) * uVar56;
  auVar49._8_2_ = (0 < (short)uVar53) * uVar53;
  auVar49._10_2_ = (0 < (short)uVar54) * uVar54;
  auVar49._12_2_ = (0 < (short)uVar55) * uVar55;
  auVar49._14_2_ = (0 < (short)uVar56) * uVar56;
  auVar59 = psubusw(auVar49,auVar59);
  auVar86._0_2_ = -(ushort)(auVar59._0_2_ == 0);
  auVar86._2_2_ = -(ushort)(auVar59._2_2_ == 0);
  auVar86._4_2_ = -(ushort)(auVar59._4_2_ == 0);
  auVar86._6_2_ = -(ushort)(auVar59._6_2_ == 0);
  auVar86._8_2_ = -(ushort)(auVar59._8_2_ == 0);
  auVar86._10_2_ = -(ushort)(auVar59._10_2_ == 0);
  auVar86._12_2_ = -(ushort)(auVar59._12_2_ == 0);
  auVar86._14_2_ = -(ushort)(auVar59._14_2_ == 0);
  auVar86 = auVar86 & auVar104;
  auVar76._0_8_ = auVar86._0_8_;
  auVar76._8_4_ = auVar86._0_4_;
  auVar76._12_4_ = auVar86._4_4_;
  auVar77._0_2_ = -(ushort)(auVar86._0_2_ == 0);
  auVar77._2_2_ = -(ushort)(auVar86._2_2_ == 0);
  auVar77._4_2_ = -(ushort)(auVar86._4_2_ == 0);
  auVar77._6_2_ = -(ushort)(auVar86._6_2_ == 0);
  auVar77._8_2_ = -(ushort)(auVar86._0_2_ == 0);
  auVar77._10_2_ = -(ushort)(auVar86._2_2_ == 0);
  auVar77._12_2_ = -(ushort)(auVar86._4_2_ == 0);
  auVar77._14_2_ = -(ushort)(auVar86._6_2_ == 0);
  if ((ushort)((ushort)(SUB161(auVar77 >> 7,0) & 1) | (ushort)(SUB161(auVar77 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar77 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar77 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar77 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar77 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar77 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar77 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar77 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar77 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar77 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar77 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar77 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar77 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar77._14_2_ >> 7) & 1) << 0xe | auVar77._14_2_ & 0x8000) != 0xffff
     ) {
    sVar57 = (short)uVar1 + (short)uVar3;
    sVar43 = (short)((ulong)uVar1 >> 0x10);
    sVar80 = (short)((ulong)uVar3 >> 0x10);
    sVar61 = sVar43 + sVar80;
    sVar44 = (short)((ulong)uVar1 >> 0x20);
    sVar81 = (short)((ulong)uVar3 >> 0x20);
    sVar62 = sVar44 + sVar81;
    sVar45 = (short)((ulong)uVar1 >> 0x30);
    sVar82 = (short)((ulong)uVar3 >> 0x30);
    sVar63 = sVar45 + sVar82;
    sVar48 = (short)((ulong)uVar6 >> 0x10);
    sVar41 = (short)((ulong)uVar2 >> 0x10);
    sVar64 = (short)((ulong)uVar6 >> 0x20);
    sVar65 = (short)((ulong)uVar6 >> 0x30);
    sVar83 = (short)((ulong)uVar2 >> 0x20);
    sVar84 = (short)((ulong)uVar2 >> 0x30);
    sVar78 = (short)uVar3 + (short)uVar4;
    sVar67 = (short)((ulong)uVar4 >> 0x10);
    sVar80 = sVar80 + sVar67;
    sVar68 = (short)((ulong)uVar4 >> 0x20);
    sVar81 = sVar81 + sVar68;
    sVar69 = (short)((ulong)uVar4 >> 0x30);
    sVar82 = sVar82 + sVar69;
    sVar70 = (short)((ulong)uVar5 >> 0x10);
    sVar71 = (short)((ulong)uVar5 >> 0x20);
    sVar72 = (short)((ulong)uVar5 >> 0x30);
    sVar42 = (short)uVar1 + sVar57 + sVar78 + 4;
    sVar43 = sVar43 + sVar61 + sVar80 + 4;
    sVar44 = sVar44 + sVar62 + sVar81 + 4;
    sVar45 = sVar45 + sVar63 + sVar82 + 4;
    uVar47 = (short)uVar6 * 2 + (short)uVar2 + sVar42;
    uVar50 = sVar48 * 2 + sVar41 + sVar43;
    uVar51 = sVar64 * 2 + sVar83 + sVar44;
    uVar52 = sVar65 * 2 + sVar84 + sVar45;
    auVar93._0_2_ = uVar47 >> 3;
    auVar93._2_2_ = uVar50 >> 3;
    auVar93._4_2_ = uVar51 >> 3;
    auVar93._6_2_ = uVar52 >> 3;
    auVar93._8_2_ = (ushort)((short)uVar4 * 2 + (short)uVar6 + sVar42) >> 3;
    auVar93._10_2_ = (ushort)(sVar67 * 2 + sVar48 + sVar43) >> 3;
    auVar93._12_2_ = (ushort)(sVar68 * 2 + sVar64 + sVar44) >> 3;
    auVar93._14_2_ = (ushort)(sVar69 * 2 + sVar65 + sVar45) >> 3;
    uVar47 = (((short)uVar2 + (short)uVar5) - sVar78) + uVar47;
    uVar50 = ((sVar41 + sVar70) - sVar80) + uVar50;
    uVar51 = ((sVar83 + sVar71) - sVar81) + uVar51;
    uVar52 = ((sVar84 + sVar72) - sVar82) + uVar52;
    auVar40._0_2_ = uVar47 >> 3;
    auVar40._2_2_ = uVar50 >> 3;
    auVar40._4_2_ = uVar51 >> 3;
    auVar40._6_2_ = uVar52 >> 3;
    auVar40._8_2_ = (ushort)(((short)uVar5 * 2 - sVar57) + uVar47) >> 3;
    auVar40._10_2_ = (ushort)((sVar70 * 2 - sVar61) + uVar50) >> 3;
    auVar40._12_2_ = (ushort)((sVar71 * 2 - sVar62) + uVar51) >> 3;
    auVar40._14_2_ = (ushort)((sVar72 * 2 - sVar63) + uVar52) >> 3;
    auVar39 = auVar40 & auVar76 | ~auVar76 & auVar39;
    auVar89 = auVar93 & auVar76 | ~auVar76 & auVar89;
  }
  *(long *)(s + -lVar38) = auVar89._8_8_;
  *(long *)(s + -lVar37) = auVar89._0_8_;
  *(long *)s = auVar39._0_8_;
  *(long *)(s + lVar37) = auVar39._8_8_;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_6_sse2(uint16_t *s, int p,
                                      const uint8_t *_blimit,
                                      const uint8_t *_limit,
                                      const uint8_t *_thresh, int bd) {
  __m128i p2, p1, p0, q0, q1, q2, p1p0_out, q1q0_out;

  p2 = _mm_loadl_epi64((__m128i *)(s - 3 * p));
  p1 = _mm_loadl_epi64((__m128i *)(s - 2 * p));
  p0 = _mm_loadl_epi64((__m128i *)(s - 1 * p));
  q0 = _mm_loadl_epi64((__m128i *)(s + 0 * p));
  q1 = _mm_loadl_epi64((__m128i *)(s + 1 * p));
  q2 = _mm_loadl_epi64((__m128i *)(s + 2 * p));

  highbd_lpf_internal_6_sse2(&p2, &p1, &p0, &q0, &q1, &q2, &p1p0_out, &q1q0_out,
                             _blimit, _limit, _thresh, bd);

  _mm_storel_epi64((__m128i *)(s - 2 * p), _mm_srli_si128(p1p0_out, 8));
  _mm_storel_epi64((__m128i *)(s - 1 * p), p1p0_out);
  _mm_storel_epi64((__m128i *)(s + 0 * p), q1q0_out);
  _mm_storel_epi64((__m128i *)(s + 1 * p), _mm_srli_si128(q1q0_out, 8));
}